

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Ptr_t * Gia_ManMiterNames(Vec_Ptr_t *p,int nOuts)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  Vec_Ptr_t *pNew;
  char local_418 [4];
  int i;
  char pBuffer [1000];
  char *pName2;
  char *pName1;
  int nOuts_local;
  Vec_Ptr_t *p_local;
  
  iVar1 = Vec_PtrSize(p);
  p_00 = Vec_PtrAlloc(iVar1 - nOuts / 2);
  if (nOuts % 2 != 0) {
    __assert_fail("nOuts % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb57,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  iVar1 = Vec_PtrSize(p);
  if (iVar1 < nOuts) {
    __assert_fail("nOuts <= Vec_PtrSize(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb58,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  for (pNew._4_4_ = 0; iVar1 = Vec_PtrSize(p), pNew._4_4_ + 1 < iVar1; pNew._4_4_ = pNew._4_4_ + 2)
  {
    pvVar2 = Vec_PtrEntry(p,pNew._4_4_);
    pvVar3 = Vec_PtrEntry(p,pNew._4_4_ + 1);
    if (pNew._4_4_ == nOuts) break;
    sprintf(local_418,"%s_xor_%s",pvVar2,pvVar3);
    pcVar4 = Abc_UtilStrsav(local_418);
    Vec_PtrPush(p_00,pcVar4);
  }
  for (; iVar1 = Vec_PtrSize(p), pNew._4_4_ < iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    pcVar4 = (char *)Vec_PtrEntry(p,pNew._4_4_);
    pcVar4 = Abc_UtilStrsav(pcVar4);
    Vec_PtrPush(p_00,pcVar4);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Gia_ManMiterNames( Vec_Ptr_t * p, int nOuts )
{
    char * pName1, * pName2, pBuffer[1000]; int i;
    Vec_Ptr_t * pNew = Vec_PtrAlloc( Vec_PtrSize(p) - nOuts/2 );
    assert( nOuts % 2 == 0 );
    assert( nOuts <= Vec_PtrSize(p) );
    Vec_PtrForEachEntryDouble( char *, char *, p, pName1, pName2, i )
    {
        if ( i == nOuts )
            break;
        sprintf( pBuffer, "%s_xor_%s", pName1, pName2 );
        Vec_PtrPush( pNew, Abc_UtilStrsav(pBuffer) );
    }
    Vec_PtrForEachEntryStart( char *, p, pName1, i, i )
        Vec_PtrPush( pNew, Abc_UtilStrsav(pName1) );
    return pNew;
}